

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffdcol(fitsfile *fptr,int colnum,int *status)

{
  FITSfile *pFVar1;
  tcolumn *ptVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  LONGLONG tbcol;
  int tstatus;
  char comm [73];
  char keyname [75];
  long local_f8;
  LONGLONG local_f0;
  LONGLONG local_e8;
  int local_dc;
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_00118713;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  if (pFVar1->hdutype == 0) {
    ffpmsg("Can only delete column from TABLE or BINTABLE extension (ffdcol)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((colnum < 1) || (iVar3 = pFVar1->tfield, iVar3 < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  ptVar2 = pFVar1->tableptr;
  local_e8 = ptVar2[(ulong)(uint)colnum - 1].tbcol;
  if (pFVar1->hdutype == 1) {
    lVar4 = ptVar2[(ulong)(uint)colnum - 1].twidth;
    if (colnum < iVar3) {
      lVar5 = ptVar2[(uint)colnum].tbcol - lVar4;
      lVar4 = lVar4 + (ulong)(lVar5 != local_e8 && -1 < lVar5 - local_e8);
    }
    else if ((colnum != 1) &&
            (lVar5 = ptVar2[(ulong)(uint)colnum - 2].tbcol + ptVar2[(ulong)(uint)colnum - 2].twidth,
            local_e8 != lVar5 && -1 < local_e8 - lVar5)) {
      lVar4 = lVar4 + 1;
      local_e8 = local_e8 + -1;
    }
  }
  else {
    if (colnum < iVar3) {
      lVar4 = ptVar2[(uint)colnum].tbcol;
    }
    else {
      lVar4 = pFVar1->rowlength;
    }
    lVar4 = lVar4 - local_e8;
  }
  local_f0 = pFVar1->rowlength;
  lVar5 = pFVar1->numrows * lVar4;
  lVar6 = pFVar1->heapsize + pFVar1->heapstart + 0xb3f;
  lVar6 = ((lVar6 / 0xb40) * 0xb40 - lVar6) + lVar5 + 0xb3f;
  ffcdel(fptr,local_f0,pFVar1->numrows,lVar4,local_e8,status);
  pFVar1 = fptr->Fptr;
  if ((pFVar1->heapsize < 1) ||
     (iVar3 = ffshft(fptr,pFVar1->heapstart + pFVar1->datastart,pFVar1->heapsize,-lVar5,status),
     iVar3 < 1)) {
    if (0xb3f < lVar6) {
      ffdblk(fptr,lVar6 / 0xb40,status);
    }
    lVar5 = fptr->Fptr->heapstart - lVar5;
    fptr->Fptr->heapstart = lVar5;
    local_dc = 0;
    ffmkyj(fptr,"THEAP",lVar5,"&",&local_dc);
    if ((fptr->Fptr->hdutype == 1) && (0 < fptr->Fptr->tfield)) {
      iVar3 = 0;
      do {
        iVar3 = iVar3 + 1;
        ffkeyn("TBCOL",iVar3,local_88,status);
        ffgkyjj(fptr,local_88,&local_f8,local_d8,status);
        if (local_e8 < local_f8) {
          local_f8 = local_f8 - lVar4;
          ffmkyj(fptr,local_88,local_f8,"&",status);
        }
      } while (iVar3 < fptr->Fptr->tfield);
    }
    ffmkyj(fptr,"TFIELDS",(long)fptr->Fptr->tfield + -1,"&",status);
    ffmkyj(fptr,"NAXIS1",local_f0 - lVar4,"&",status);
    ffkshf(fptr,colnum,fptr->Fptr->tfield,-1,status);
    ffrdef(fptr,status);
  }
LAB_00118713:
  return *status;
}

Assistant:

int ffdcol(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colnum,      /* I - column to delete (1 = 1st)               */
           int *status)     /* IO - error status                            */
/*
  Delete a column from a table.
*/
{
    int ii, tstatus;
    LONGLONG firstbyte, size, ndelete, nbytes, naxis1, naxis2, firstcol, delbyte, freespace;
    LONGLONG tbcol;
    long nblock, nspace;
    char keyname[FLEN_KEYWORD], comm[FLEN_COMMENT];
    tcolumn *colptr, *nextcol;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can only delete column from TABLE or BINTABLE extension (ffdcol)");
       return(*status = NOT_TABLE);
    }

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield )
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;
    colptr += (colnum - 1);
    firstcol = colptr->tbcol;  /* starting byte position of the column */

    /* use column width to determine how many bytes to delete in each row */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
      delbyte = colptr->twidth;  /* width of ASCII column */

      if (colnum < (fptr->Fptr)->tfield) /* check for space between next column */
      {
        nextcol = colptr + 1;
        nspace = (long) ((nextcol->tbcol) - (colptr->tbcol) - delbyte);
        if (nspace > 0)
            delbyte++;
      }
      else if (colnum > 1)   /* check for space between last 2 columns */
      {
        nextcol = colptr - 1;
        nspace = (long) ((colptr->tbcol) - (nextcol->tbcol) - (nextcol->twidth));
        if (nspace > 0)
        {
           delbyte++;
           firstcol--;  /* delete the leading space */
        }
      }
    }
    else   /* a binary table */
    {
      if (colnum < (fptr->Fptr)->tfield)
      {
         nextcol = colptr + 1;
         delbyte = (nextcol->tbcol) - (colptr->tbcol);
      }
      else
      {
         delbyte = ((fptr->Fptr)->rowlength) - (colptr->tbcol);
      }
    }

    naxis1 = (fptr->Fptr)->rowlength;   /* current width of the table */
    naxis2 = (fptr->Fptr)->numrows;

    /* current size of table */
    size = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ((LONGLONG)delbyte * naxis2) + ((size + 2879) / 2880) * 2880 - size;
    nblock = (long) (freespace / 2880);   /* number of empty blocks to delete */

    ffcdel(fptr, naxis1, naxis2, delbyte, firstcol, status); /* delete col */

    /* absolute heap position */
    firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;
    ndelete = (LONGLONG)delbyte * naxis2; /* size of shift */

    /* shift heap up (if it exists) */
    if ((fptr->Fptr)->heapsize > 0)
    {
      nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift up */

      if (ffshft(fptr, firstbyte, nbytes, -ndelete, status) > 0) /* mv heap */
          return(*status);
    }

    /* delete the empty  blocks at the end of the HDU */
    if (nblock > 0)
        ffdblk(fptr, nblock, status);

    /* update the heap starting address */
    (fptr->Fptr)->heapstart -= ndelete;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (long)(fptr->Fptr)->heapstart, "&", &tstatus);

    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
      /* adjust the TBCOL values of the remaining columns */
      for (ii = 1; ii <= (fptr->Fptr)->tfield; ii++)
      {
        ffkeyn("TBCOL", ii, keyname, status);
        ffgkyjj(fptr, keyname, &tbcol, comm, status);
        if (tbcol > firstcol)
        {
          tbcol = tbcol - delbyte;
          ffmkyj(fptr, keyname, tbcol, "&", status);
        }
      }
    }

    /* update the mandatory keywords */
    ffmkyj(fptr, "TFIELDS", ((fptr->Fptr)->tfield) - 1, "&", status);        
    ffmkyj(fptr,  "NAXIS1",   naxis1 - delbyte, "&", status);
    /*
      delete the index keywords starting with 'T' associated with the 
      deleted column and subtract 1 from index of all higher keywords
    */
    ffkshf(fptr, colnum, (fptr->Fptr)->tfield, -1, status);

    ffrdef(fptr, status);  /* initialize the new table structure */
    return(*status);
}